

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions_core.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Return<std::vector<int,std::allocator<int>>>::
get<_Into<std::vector<int,std::allocator<int>>,BackInserter<std::vector<int,std::allocator<int>>>>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Return<std::vector<int,std::allocator<int>>> *this,
          _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
          *node)

{
  ResultType local_30;
  Return<std::vector<int,std::allocator<int>>> *local_18;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *node_local;
  
  local_18 = this;
  node_local = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
                *)__return_storage_ptr__;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  ::get(&local_30,
        (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
         *)this);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static _T get(_Node& node)
    {
        return std::move(node.get());
    }